

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::EqHelper<false>::Compare<(anonymous_namespace)::weekday,signed_char>
          (EqHelper<false> *this,char *lhs_expression,char *rhs_expression,weekday *lhs,char *rhs)

{
  AssertionResult AVar1;
  char *rhs_local;
  weekday *lhs_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  
  AVar1 = CmpHelperEQ<(anonymous_namespace)::weekday,signed_char>
                    ((internal *)this,lhs_expression,rhs_expression,lhs,rhs);
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

static AssertionResult Compare(const char* lhs_expression,
                                 const char* rhs_expression,
                                 const T1& lhs,
                                 const T2& rhs) {
    return CmpHelperEQ(lhs_expression, rhs_expression, lhs, rhs);
  }